

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_stream.h
# Opt level: O2

OutStream * __thiscall
r_comp::OutStream::push<char[39]>(OutStream *this,char (*t) [39],uint16_t code_index)

{
  int iVar1;
  int iVar2;
  unsigned_short *puVar3;
  OutStream *pOVar4;
  undefined6 in_register_00000012;
  fpos<__mbstate_t> t_00;
  
  t_00 = (fpos<__mbstate_t>)std::ostream::tellp();
  r_code::vector<std::fpos<__mbstate_t>_>::push_back(&this->positions,t_00);
  iVar1 = *(int *)&(this->positions).m_vector.
                   super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this->positions).m_vector.
                   super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = r_code::vector<unsigned_short>::operator[]
                     (&this->code_indexes_to_stream_indexes,
                      CONCAT62(in_register_00000012,code_index) & 0xffffffff);
  *puVar3 = (short)((uint)(iVar1 - iVar2) >> 4) - 1;
  pOVar4 = operator<<(this,t);
  return pOVar4;
}

Assistant:

OutStream &push(const T &t, uint16_t code_index)
    {
        positions.push_back(stream->tellp());
        code_indexes_to_stream_indexes[code_index] = positions.size() - 1;
        return *this << t;
    }